

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::replace_prelu_with_leaky_relu(NetOptimize *this)

{
  FILE *__stream;
  bool bVar1;
  reference ppLVar2;
  undefined8 uVar3;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  ParamDict pd;
  ReLU *relu;
  PReLU *prelu;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff68;
  Layer *in_stack_ffffffffffffff70;
  ParamDict *this_00;
  undefined1 local_48 [16];
  Layer *local_38;
  value_type local_30;
  size_type local_28;
  ulong local_20;
  undefined8 local_10;
  bool *local_8;
  
  local_20 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_28);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) {
      ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_28);
      __stream = _stderr;
      local_30 = *ppLVar2;
      if (*(int *)&local_30[1]._vptr_Layer == 1) {
        uVar3 = std::__cxx11::string::c_str();
        fprintf(__stream,"replace_prelu_with_leaky_relu %s\n",uVar3);
        this_00 = (ParamDict *)0x1f165d4;
        local_38 = ncnn::create_layer(in_stack_ffffffffffffff68);
        std::__cxx11::string::operator=((string *)&local_38->type,(char *)this_00);
        std::__cxx11::string::operator=((string *)&local_38->name,(string *)&local_30->name);
        std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000010,in_stack_00000008);
        std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000010,in_stack_00000008);
        ncnn::ParamDict::ParamDict(this_00);
        (*local_38->_vptr_Layer[2])(local_38,local_48);
        local_8 = &local_30[1].one_blob_only;
        local_10 = 0;
        *(undefined4 *)&local_38[1]._vptr_Layer = **(undefined4 **)local_8;
        in_stack_ffffffffffffff70 = local_38;
        ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        *ppLVar2 = in_stack_ffffffffffffff70;
        if (local_30 != (value_type)0x0) {
          (*local_30->_vptr_Layer[1])();
        }
        ncnn::ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffff70);
      }
    }
  }
  return 0;
}

Assistant:

int NetOptimize::replace_prelu_with_leaky_relu()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "PReLU")
            continue;

        ncnn::PReLU* prelu = (ncnn::PReLU*)layers[i];
        if (prelu->num_slope != 1)
            continue;

        fprintf(stderr, "replace_prelu_with_leaky_relu %s\n", prelu->name.c_str());

        ncnn::ReLU* relu = (ncnn::ReLU*)ncnn::create_layer("ReLU");

        relu->type = "ReLU";
        relu->name = prelu->name;
        relu->bottoms = prelu->bottoms;
        relu->tops = prelu->tops;

        ncnn::ParamDict pd;
        relu->load_param(pd);

        relu->slope = prelu->slope_data[0];

        layers[i] = relu;
        delete prelu;
    }

    return 0;
}